

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::write_nonfinite<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,bool isinf,
          basic_format_specs<char> *specs,float_specs *fspecs)

{
  uint uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  char *pcVar6;
  buffer<char> *c;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar3 = (ulong)specs->width;
  if (-1 < (long)uVar3) {
    uVar1 = *(uint *)&fspecs->field_0x4;
    uVar5 = uVar1 >> 8 & 0xff;
    uVar8 = 4 - (ulong)(uVar5 == 0);
    uVar9 = 0;
    if (uVar8 <= uVar3) {
      uVar9 = uVar3 - uVar8;
    }
    uVar3 = uVar9 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = (out.container)->size_;
    uVar8 = uVar8 + sVar2 + (specs->fill).size_ * uVar9;
    if ((out.container)->capacity_ < uVar8) {
      (**(out.container)->_vptr_buffer)(out.container,uVar8);
    }
    (out.container)->size_ = uVar8;
    pcVar4 = fill<char*,char>((out.container)->ptr_ + sVar2,uVar3,&specs->fill);
    if (uVar5 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar5);
      pcVar4 = pcVar4 + 1;
    }
    bVar10 = (uVar1 >> 0x10 & 1) == 0;
    pcVar6 = "INF";
    if (bVar10) {
      pcVar6 = "inf";
    }
    pcVar7 = "NAN";
    if (bVar10) {
      pcVar7 = "nan";
    }
    if (isinf) {
      pcVar7 = pcVar6;
    }
    pcVar4[2] = pcVar7[2];
    *(undefined2 *)pcVar4 = *(undefined2 *)pcVar7;
    fill<char*,char>(pcVar4 + 3,uVar9 - uVar3,&specs->fill);
    return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container;
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}